

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MADEC-CORE.cpp
# Opt level: O1

void build_non_adjacent_table
               (vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *edges)

{
  long lVar1;
  pointer *pppVar2;
  int iVar3;
  int iVar4;
  pointer ppVar5;
  pointer ppVar6;
  iterator __position;
  void *__s;
  ulong uVar7;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *__range1;
  int iVar8;
  pair<int,_int> *e;
  pointer ppVar9;
  pair<int,_int> pVar10;
  long lVar11;
  int local_4c;
  pair<int,_int> local_48;
  pair<int,_int> local_38;
  
  iVar8 = size;
  lVar11 = (long)size;
  __s = operator_new__((ulong)(uint)(size * size));
  memset(__s,0,lVar11 * lVar11);
  ppVar6 = (edges->super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  ppVar5 = (edges->super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
           _M_impl.super__Vector_impl_data._M_start;
  for (ppVar9 = ppVar5; ppVar9 != ppVar6; ppVar9 = ppVar9 + 1) {
    iVar3 = ppVar9->first;
    iVar4 = ppVar9->second;
    *(undefined1 *)((long)__s + (long)(iVar3 * iVar8 + iVar4)) = 1;
    *(undefined1 *)((long)__s + (long)(iVar4 * iVar8 + iVar3)) = 1;
  }
  if (ppVar6 != ppVar5) {
    (edges->super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
    super__Vector_impl_data._M_finish = ppVar5;
  }
  if (0 < size) {
    local_4c = 1;
    local_48.first = 0;
    local_48.second = 1;
    lVar11 = 0;
    do {
      lVar1 = lVar11 + 1;
      uVar7 = (ulong)size;
      pVar10 = local_48;
      iVar8 = local_4c;
      if (lVar1 < (long)uVar7) {
        do {
          if (*(char *)((long)__s + (long)((int)uVar7 * (int)lVar11 + iVar8)) == '\0') {
            __position._M_current =
                 (edges->
                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
            local_38 = pVar10;
            if (__position._M_current ==
                (edges->
                super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
              _M_realloc_insert<std::pair<int,int>>
                        ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)edges,
                         __position,&local_38);
            }
            else {
              *__position._M_current = pVar10;
              pppVar2 = &(edges->
                         super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish;
              *pppVar2 = *pppVar2 + 1;
            }
          }
          uVar7 = (ulong)(uint)size;
          iVar8 = iVar8 + 1;
          pVar10 = (pair<int,_int>)((long)pVar10 + 0x100000000);
        } while (iVar8 < size);
      }
      local_4c = local_4c + 1;
      local_48 = (pair<int,_int>)((long)local_48 + 0x100000001);
      lVar11 = lVar1;
    } while (lVar1 < size);
  }
  operator_delete__(__s);
  build_adjacent_table(edges,&NAdjB,NAdjP);
  return;
}

Assistant:

void build_non_adjacent_table(vector<pair<int, int> > edges) {
    bool *graph = new bool[size * size];
    memset(graph, 0, sizeof(bool) * size * size);
    for (auto &e: edges) {
        graph[e.first * size + e.second] = true;
        graph[e.second * size + e.first] = true;
    }
    edges.clear();
    for (int i = 0; i < size; ++i) 
        for (int j = i+1; j < size; ++j) if (!graph[i * size + j]) {
            edges.push_back(make_pair(i, j));
        }
    delete[] graph;
    build_adjacent_table(edges, &NAdjB, NAdjP);
}